

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr.cpp
# Opt level: O3

Ref<embree::Image> __thiscall embree::loadEXR(embree *this,FileName *fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  ImageT<embree::Col4<float>_> *this_00;
  runtime_error *this_01;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  size_t width_00;
  char *err;
  int height;
  int width;
  Ref<embree::Image> *img;
  float *rgba;
  long local_b0;
  char *local_a8;
  int local_a0;
  int local_9c;
  string local_98;
  Image *local_70;
  float *local_68;
  long local_60;
  size_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8 = (char *)0x0;
  paVar1 = &local_98.field_2;
  pcVar2 = (fileName->filename)._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  local_70 = (Image *)this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (fileName->filename)._M_string_length);
  iVar3 = LoadEXRWithLayer(&local_68,&local_9c,&local_a0,local_98._M_dataplus._M_p,(char *)0x0,
                           &local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (iVar3 == 0) {
    this_00 = (ImageT<embree::Col4<float>_> *)operator_new(0x48);
    width_00 = (size_t)local_9c;
    pcVar2 = (fileName->filename)._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + (fileName->filename)._M_string_length);
    ImageT<embree::Col4<float>_>::ImageT(this_00,width_00,(long)local_a0,&local_98);
    (local_70->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
    (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (0 < local_a0) {
      local_60 = width_00 << 4;
      local_b0 = 4;
      sVar6 = 0;
      local_58 = (long)local_a0;
      do {
        if (0 < local_9c) {
          sVar4 = 0;
          lVar5 = local_b0;
          do {
            local_98._M_string_length._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)local_68 + lVar5) >> 0x20);
            local_98._M_dataplus._M_p._4_4_ = (int)*(undefined8 *)((long)local_68 + lVar5);
            local_98._M_dataplus._M_p._0_4_ = *(undefined4 *)((long)local_68 + lVar5 + -4);
            local_98._M_string_length._4_4_ = 0x3f800000;
            (*(this_00->super_Image).super_RefCount._vptr_RefCount[5])
                      (this_00,sVar4,sVar6,&local_98);
            sVar4 = sVar4 + 1;
            lVar5 = lVar5 + 0x10;
          } while (width_00 != sVar4);
        }
        sVar6 = sVar6 + 1;
        local_b0 = local_b0 + local_60;
      } while (sVar6 != local_58);
    }
    free(local_68);
    return (Ref<embree::Image>)local_70;
  }
  if (local_a8 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERR: ",5);
    std::operator<<((ostream *)&std::cerr,local_a8);
    if (local_a8 != (char *)0x0) {
      free(local_a8);
    }
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar2 = (fileName->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (fileName->filename)._M_string_length);
  std::operator+(&local_98,"Could not load image ",&local_50);
  std::runtime_error::runtime_error(this_01,(string *)&local_98);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<Image> loadEXR(const FileName& fileName)
  {
    float* rgba; // width * height * RGBA
    int width;
    int height;
    const char* err = NULL; // or nullptr in C++11

    int ret = LoadEXR(&rgba, &width, &height, fileName.str().c_str(), &err);
    if (ret != TINYEXR_SUCCESS) {
      if (err) {
        std::cerr << "ERR: " << err;
        FreeEXRErrorMessage(err);
      }
      THROW_RUNTIME_ERROR("Could not load image " + fileName.str())
    }

    /* create image and fill with data */
    Ref<Image> img = new Image4f(width,height,fileName);

    for (ssize_t y=0; y<height; y++) {
      for (ssize_t x=0; x<width; x++) {
        float* pix = rgba + (y * width + x) * 4;
        img->set(x,y,Color4(pix[0],pix[1],pix[2],1.0f));
      }
    }
    free(rgba);
    return img;
  }